

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O0

void __thiscall
winmd::reader::CustomAttributeSig::CustomAttributeSig
          (CustomAttributeSig *this,table_base *table,byte_view *data,MethodDefSig *ctor)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  __normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>
  *p_Var4;
  ushort local_104;
  allocator<char> local_101;
  undefined1 local_100 [4];
  uint16_t i;
  ushort local_da;
  undefined1 local_d8 [6];
  unsigned_short num_named_args;
  reference local_a0;
  ParamSig *param;
  __normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>
  __end2;
  __normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>
  __begin2;
  pair<__gnu_cxx::__normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>,___gnu_cxx::__normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>_>
  *__range2;
  string local_68;
  unsigned_short local_32;
  database *pdStack_30;
  unsigned_short prolog;
  database *db;
  MethodDefSig *ctor_local;
  byte_view *data_local;
  table_base *table_local;
  CustomAttributeSig *this_local;
  
  db = (database *)ctor;
  ctor_local = (MethodDefSig *)data;
  data_local = (byte_view *)table;
  table_local = (table_base *)this;
  cppwinrt::std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::
  vector(&this->m_fixed_args);
  cppwinrt::std::vector<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>::
  vector(&this->m_named_args);
  pdStack_30 = table_base::get_database((table_base *)data_local);
  local_32 = read<unsigned_short>((byte_view *)ctor_local);
  if (local_32 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"CustomAttribute blobs must start with prolog of 0x0001",
               (allocator<char> *)((long)&__range2 + 7));
    impl::throw_invalid(&local_68);
  }
  ___begin2 = MethodDefSig::Params((MethodDefSig *)db);
  p_Var4 = begin<__gnu_cxx::__normal_iterator<winmd::reader::ParamSig_const*,std::vector<winmd::reader::ParamSig,std::allocator<winmd::reader::ParamSig>>>>
                     ((pair<__gnu_cxx::__normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>,___gnu_cxx::__normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>_>
                       *)&__begin2);
  __end2._M_current = p_Var4->_M_current;
  p_Var4 = end<__gnu_cxx::__normal_iterator<winmd::reader::ParamSig_const*,std::vector<winmd::reader::ParamSig,std::allocator<winmd::reader::ParamSig>>>>
                     ((pair<__gnu_cxx::__normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>,___gnu_cxx::__normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>_>
                       *)&__begin2);
  param = p_Var4->_M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>
                                *)&param);
    if (!bVar1) break;
    local_a0 = __gnu_cxx::
               __normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>
               ::operator*(&__end2);
    FixedArgSig::FixedArgSig((FixedArgSig *)local_d8,pdStack_30,local_a0,(byte_view *)ctor_local);
    cppwinrt::std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::
    push_back(&this->m_fixed_args,(value_type *)local_d8);
    FixedArgSig::~FixedArgSig((FixedArgSig *)local_d8);
    __gnu_cxx::
    __normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>
    ::operator++(&__end2);
  }
  local_da = read<unsigned_short>((byte_view *)ctor_local);
  uVar2 = (uint)local_da;
  uVar3 = byte_view::size((byte_view *)ctor_local);
  if (uVar3 < uVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_100,"Invalid blob array size",&local_101);
    impl::throw_invalid((string *)local_100);
  }
  cppwinrt::std::vector<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>::
  reserve(&this->m_named_args,(ulong)local_da);
  for (local_104 = 0; local_104 < local_da; local_104 = local_104 + 1) {
    std::vector<winmd::reader::NamedArgSig,std::allocator<winmd::reader::NamedArgSig>>::
    emplace_back<winmd::reader::database_const&,winmd::reader::byte_view&>
              ((vector<winmd::reader::NamedArgSig,std::allocator<winmd::reader::NamedArgSig>> *)
               &this->m_named_args,pdStack_30,(byte_view *)ctor_local);
  }
  return;
}

Assistant:

CustomAttributeSig(table_base const* table, byte_view& data, MethodDefSig const& ctor)
        {
            database const& db = table->get_database();
            auto const prolog = read<uint16_t>(data);
            if (prolog != 0x0001)
            {
                impl::throw_invalid("CustomAttribute blobs must start with prolog of 0x0001");
            }

            for (auto const& param : ctor.Params())
            {
                m_fixed_args.push_back(FixedArgSig{ db, param, data });
            }

            const auto num_named_args = read<uint16_t>(data);
            if (num_named_args > data.size())
            {
                impl::throw_invalid("Invalid blob array size");
            }
            m_named_args.reserve(num_named_args);

            for (uint16_t i = 0; i < num_named_args; ++i)
            {
                m_named_args.emplace_back(db, data);
            }
        }